

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O3

char * linetostr(line *ln)

{
  char *__dest;
  size_t __n;
  
  __n = (size_t)ln->l_used;
  if ((__n != 0x7fffffff) && (__dest = (char *)malloc(__n + 1), __dest != (char *)0x0)) {
    memcpy(__dest,ln->l_text,__n);
    __dest[__n] = '\0';
    return __dest;
  }
  return (char *)0x0;
}

Assistant:

char *
linetostr(const struct line *ln)
{
	int	 len;
	char	*line;

	len = llength(ln);
	if (len == INT_MAX)  /* (len + 1) overflow */
		return (NULL);

	if ((line = malloc(len + 1)) == NULL)
		return (NULL);

	(void)memcpy(line, ltext(ln), len);
	line[len] = '\0';

	return (line);
}